

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserEvent.h
# Opt level: O1

void __thiscall
UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UserEvent(UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  pointer pcVar1;
  
  Event::Event(&this->super_Event,(ev->super_Event).type);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__UserEvent_00108b30;
  (this->object)._M_dataplus._M_p = (pointer)&(this->object).field_2;
  pcVar1 = (ev->object)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->object,pcVar1,pcVar1 + (ev->object)._M_string_length);
  return;
}

Assistant:

UserEvent(const UserEvent<T> &ev) :
            Event(ev.type), object(ev.object) {}